

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_MuxTraverse_rec(Gia_Man_t *p,int i)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int i_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,i);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,i);
    pObj_00 = Gia_ManObj(p,i);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,i);
      Str_MuxTraverse_rec(p,iVar1);
      iVar1 = Gia_ObjFaninId1(pObj_00,i);
      Str_MuxTraverse_rec(p,iVar1);
      iVar1 = Gia_ObjIsMux(p,pObj_00);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId2(p,i);
        Str_MuxTraverse_rec(p,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Str_MuxTraverse_rec( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, i) )
        return;
    Gia_ObjSetTravIdCurrentId(p, i);
    pObj = Gia_ManObj(p, i);
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Str_MuxTraverse_rec(p, Gia_ObjFaninId0(pObj, i) );
    Str_MuxTraverse_rec(p, Gia_ObjFaninId1(pObj, i) );
    if ( Gia_ObjIsMux(p, pObj) )
        Str_MuxTraverse_rec(p, Gia_ObjFaninId2(p, i) );
}